

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall
wabt::RegisterCommand::RegisterCommand(RegisterCommand *this,string_view module_name,Var *var)

{
  undefined1 local_28 [8];
  string_view module_name_local;
  
  module_name_local.data_ = (char *)module_name.size_;
  local_28 = (undefined1  [8])module_name.data_;
  (this->super_CommandMixin<(wabt::CommandType)2>).super_Command.type = Register;
  (this->super_CommandMixin<(wabt::CommandType)2>).super_Command._vptr_Command =
       (_func_int **)&PTR__RegisterCommand_0155dba8;
  string_view::operator_cast_to_string(&this->module_name,(string_view *)local_28);
  Var::Var(&this->var,var);
  return;
}

Assistant:

RegisterCommand(string_view module_name, const Var& var)
      : module_name(module_name), var(var) {}